

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPValAttrBlockFinal
              (xmlChar *value,int *flags,int flagAll,int flagExtension,int flagRestriction,
              int flagSubstitution,int flagList,int flagUnion)

{
  int iVar1;
  xmlChar *str1;
  bool bVar2;
  xmlChar *item;
  xmlChar *cur;
  xmlChar *end;
  int ret;
  int flagSubstitution_local;
  int flagRestriction_local;
  int flagExtension_local;
  int flagAll_local;
  int *flags_local;
  xmlChar *value_local;
  
  end._4_4_ = 0;
  if ((flags == (int *)0x0) || (value == (xmlChar *)0x0)) {
    value_local._4_4_ = -1;
  }
  else if (*value == '\0') {
    value_local._4_4_ = 0;
  }
  else {
    iVar1 = xmlStrEqual(value,(xmlChar *)"#all");
    item = value;
    if (iVar1 == 0) {
      do {
        while( true ) {
          bVar2 = true;
          if ((*item != ' ') && ((*item < 9 || (bVar2 = true, 10 < *item)))) {
            bVar2 = *item == '\r';
          }
          if (!bVar2) break;
          item = item + 1;
        }
        cur = item;
        while( true ) {
          bVar2 = false;
          if (*cur != '\0') {
            bVar2 = true;
            if ((*cur != ' ') && ((*cur < 9 || (bVar2 = true, 10 < *cur)))) {
              bVar2 = *cur == '\r';
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
          if (!bVar2) break;
          cur = cur + 1;
        }
        if (cur == item) break;
        str1 = xmlStrndup(item,(int)cur - (int)item);
        iVar1 = xmlStrEqual(str1,(xmlChar *)"extension");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(str1,(xmlChar *)"restriction");
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(str1,(xmlChar *)"substitution");
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(str1,"list");
              if (iVar1 == 0) {
                iVar1 = xmlStrEqual(str1,"union");
                if (iVar1 == 0) {
                  end._4_4_ = 1;
                }
                else if (flagUnion == -1) {
                  end._4_4_ = 1;
                }
                else if ((*flags & flagUnion) == 0) {
                  *flags = flagUnion | *flags;
                }
              }
              else if (flagList == -1) {
                end._4_4_ = 1;
              }
              else if ((*flags & flagList) == 0) {
                *flags = flagList | *flags;
              }
            }
            else if (flagSubstitution == -1) {
              end._4_4_ = 1;
            }
            else if ((*flags & flagSubstitution) == 0) {
              *flags = flagSubstitution | *flags;
            }
          }
          else if (flagRestriction == -1) {
            end._4_4_ = 1;
          }
          else if ((*flags & flagRestriction) == 0) {
            *flags = flagRestriction | *flags;
          }
        }
        else if (flagExtension == -1) {
          end._4_4_ = 1;
        }
        else if ((*flags & flagExtension) == 0) {
          *flags = flagExtension | *flags;
        }
        if (str1 != (xmlChar *)0x0) {
          (*xmlFree)(str1);
        }
        item = cur;
        bVar2 = false;
        if (end._4_4_ == 0) {
          bVar2 = *cur != '\0';
        }
      } while (bVar2);
    }
    else if (flagAll == -1) {
      if (flagExtension != -1) {
        *flags = flagExtension | *flags;
      }
      if (flagRestriction != -1) {
        *flags = flagRestriction | *flags;
      }
      if (flagSubstitution != -1) {
        *flags = flagSubstitution | *flags;
      }
      if (flagList != -1) {
        *flags = flagList | *flags;
      }
      if (flagUnion != -1) {
        *flags = flagUnion | *flags;
      }
    }
    else {
      *flags = flagAll | *flags;
    }
    value_local._4_4_ = end._4_4_;
  }
  return value_local._4_4_;
}

Assistant:

static int
xmlSchemaPValAttrBlockFinal(const xmlChar *value,
			    int *flags,
			    int flagAll,
			    int flagExtension,
			    int flagRestriction,
			    int flagSubstitution,
			    int flagList,
			    int flagUnion)
{
    int ret = 0;

    /*
    * TODO: This does not check for duplicate entries.
    */
    if ((flags == NULL) || (value == NULL))
	return (-1);
    if (value[0] == 0)
	return (0);
    if (xmlStrEqual(value, BAD_CAST "#all")) {
	if (flagAll != -1)
	    *flags |= flagAll;
	else {
	    if (flagExtension != -1)
		*flags |= flagExtension;
	    if (flagRestriction != -1)
		*flags |= flagRestriction;
	    if (flagSubstitution != -1)
		*flags |= flagSubstitution;
	    if (flagList != -1)
		*flags |= flagList;
	    if (flagUnion != -1)
		*flags |= flagUnion;
	}
    } else {
	const xmlChar *end, *cur = value;
	xmlChar *item;

	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    item = xmlStrndup(cur, end - cur);
	    if (xmlStrEqual(item, BAD_CAST "extension")) {
		if (flagExtension != -1) {
		    if ((*flags & flagExtension) == 0)
			*flags |= flagExtension;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "restriction")) {
		if (flagRestriction != -1) {
		    if ((*flags & flagRestriction) == 0)
			*flags |= flagRestriction;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "substitution")) {
		if (flagSubstitution != -1) {
		    if ((*flags & flagSubstitution) == 0)
			*flags |= flagSubstitution;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "list")) {
		if (flagList != -1) {
		    if ((*flags & flagList) == 0)
			*flags |= flagList;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "union")) {
		if (flagUnion != -1) {
		    if ((*flags & flagUnion) == 0)
			*flags |= flagUnion;
		} else
		    ret = 1;
	    } else
		ret = 1;
	    if (item != NULL)
		xmlFree(item);
	    cur = end;
	} while ((ret == 0) && (*cur != 0));
    }

    return (ret);
}